

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_panel.cxx
# Opt level: O0

void cb_tooltips_button(Fl_Check_Button *param_1,void *param_2)

{
  char cVar1;
  void *param_1_local;
  Fl_Check_Button *param_0_local;
  
  cVar1 = Fl_Button::value((Fl_Button *)tooltips_button);
  Fl_Tooltip::enable((int)cVar1);
  cVar1 = Fl_Button::value((Fl_Button *)tooltips_button);
  Fl_Preferences::set(&fluid_prefs,"show_tooltips",(int)cVar1);
  return;
}

Assistant:

static void cb_tooltips_button(Fl_Check_Button*, void*) {
  Fl_Tooltip::enable(tooltips_button->value());
fluid_prefs.set("show_tooltips", tooltips_button->value());
}